

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.h
# Opt level: O3

uint cppwinrt::get_attribute_value<unsigned_int>(CustomAttribute *attribute,uint32_t arg)

{
  uint uVar1;
  variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_std::basic_string_view<char,_std::char_traits<char>_>,_winmd::reader::ElemSig::SystemType,_winmd::reader::ElemSig::EnumValue>
  *__v;
  variant_alternative_t<6UL,_variant<bool,_char16_t,_unsigned_char,_signed_char,_unsigned_short,_short,_unsigned_int,_int,_unsigned_long,_long,_float,_double,_basic_string_view<char,_char_traits<char>_>,_SystemType,_EnumValue>_>
  *pvVar2;
  CustomAttributeSig local_40;
  
  winmd::reader::CustomAttribute::Value(&local_40,attribute);
  __v = &std::
         get<0ul,winmd::reader::ElemSig,std::vector<winmd::reader::ElemSig,std::allocator<winmd::reader::ElemSig>>>
                   (&local_40.m_fixed_args.
                     super__Vector_base<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>
                     ._M_impl.super__Vector_impl_data._M_start[arg].value)->value;
  pvVar2 = std::
           get<6ul,bool,char16_t,unsigned_char,signed_char,unsigned_short,short,unsigned_int,int,unsigned_long,long,float,double,std::basic_string_view<char,std::char_traits<char>>,winmd::reader::ElemSig::SystemType,winmd::reader::ElemSig::EnumValue>
                     (__v);
  uVar1 = *pvVar2;
  std::vector<winmd::reader::NamedArgSig,_std::allocator<winmd::reader::NamedArgSig>_>::~vector
            (&local_40.m_named_args);
  std::vector<winmd::reader::FixedArgSig,_std::allocator<winmd::reader::FixedArgSig>_>::~vector
            (&local_40.m_fixed_args);
  return uVar1;
}

Assistant:

auto get_attribute_value(CustomAttribute const& attribute, uint32_t const arg)
    {
        return get_attribute_value<T>(attribute.Value().FixedArgs()[arg]);
    }